

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O3

Node * __thiscall Parser::parseTernaryOp(Parser *this)

{
  Token *t;
  int iVar1;
  pointer pTVar2;
  CompilationContext *pCVar3;
  bool bVar4;
  Node *pNVar5;
  Node *if_true;
  Node *if_false;
  long *plVar6;
  undefined8 *puVar7;
  long *plVar8;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  pNVar5 = parseNullCoalesce(this);
  if (pNVar5 != (Node *)0x0) {
    iVar1 = this->pos;
    pTVar2 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pTVar2[iVar1].type != TK_QMARK) {
      return pNVar5;
    }
    t = pTVar2 + iVar1;
    this->tok = t;
    this->pos = iVar1 + 1;
    if_true = parseTernaryOp(this);
    if (if_true == (Node *)0x0) {
      pCVar3 = this->ctx;
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,"expected expression but \'","");
      plVar6 = (long *)std::__cxx11::string::append((char *)local_48);
      local_88 = &local_78;
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_78 = *plVar8;
        lStack_70 = plVar6[3];
      }
      else {
        local_78 = *plVar8;
        local_88 = (long *)*plVar6;
      }
      local_80 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_88);
      local_68 = &local_58;
      plVar8 = plVar6 + 2;
      if ((long *)*plVar6 == plVar8) {
        local_58 = *plVar8;
        lStack_50 = plVar6[3];
      }
      else {
        local_58 = *plVar8;
        local_68 = (long *)*plVar6;
      }
      local_60 = plVar6[1];
      *plVar6 = (long)plVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      pTVar2 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      CompilationContext::error
                (pCVar3,0x79,(char *)local_68,pTVar2[this->pos].line,(uint)pTVar2[this->pos].column)
      ;
    }
    else {
      bVar4 = expect(this,TK_COLON);
      if (bVar4) {
        if_false = parseTernaryOp(this);
        if (if_false != (Node *)0x0) {
          pNVar5 = createTernaryOpNode(this,t,pNVar5,if_true,if_false);
          return pNVar5;
        }
        pCVar3 = this->ctx;
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,"expected expression but \'","");
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)local_48);
        local_88 = &local_78;
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_78 = *plVar6;
          lStack_70 = puVar7[3];
        }
        else {
          local_78 = *plVar6;
          local_88 = (long *)*puVar7;
        }
        local_80 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_88);
        local_68 = &local_58;
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_58 = *plVar6;
          lStack_50 = puVar7[3];
        }
        else {
          local_58 = *plVar6;
          local_68 = (long *)*puVar7;
        }
        local_60 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        pTVar2 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        CompilationContext::error
                  (pCVar3,0x7b,(char *)local_68,pTVar2[this->pos].line,
                   (uint)pTVar2[this->pos].column);
      }
      else {
        pCVar3 = this->ctx;
        local_48[0] = local_38;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_48,"expected \':\' but \'","");
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)local_48);
        local_88 = &local_78;
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_78 = *plVar6;
          lStack_70 = puVar7[3];
        }
        else {
          local_78 = *plVar6;
          local_88 = (long *)*puVar7;
        }
        local_80 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_88);
        local_68 = &local_58;
        plVar6 = puVar7 + 2;
        if ((long *)*puVar7 == plVar6) {
          local_58 = *plVar6;
          lStack_50 = puVar7[3];
        }
        else {
          local_58 = *plVar6;
          local_68 = (long *)*puVar7;
        }
        local_60 = puVar7[1];
        *puVar7 = plVar6;
        puVar7[1] = 0;
        *(undefined1 *)(puVar7 + 2) = 0;
        pTVar2 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        CompilationContext::error
                  (pCVar3,0x7a,(char *)local_68,pTVar2[this->pos].line,
                   (uint)pTVar2[this->pos].column);
      }
    }
    if (local_68 != &local_58) {
      operator_delete(local_68);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  return (Node *)0x0;
}

Assistant:

Node * parseTernaryOp()
  {
    Node * expr = parseNullCoalesce();
    if (!expr)
      return nullptr;

    if (!accept(TK_QMARK))
      return expr;

    Token & qmarkToken = *tok;

    Node * ifTrue = parseTernaryOp();
    if (!ifTrue)
    {
      ctx.error(121, (string("expected expression but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    if (!expect(TK_COLON))
    {
      ctx.error(122, (string("expected ':' but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    Node * ifFalse = parseTernaryOp();
    if (!ifFalse)
    {
      ctx.error(123, (string("expected expression but '") + token_strings[tokens[pos].type] + "' found").c_str(),
        tokens[pos].line, tokens[pos].column);
      return nullptr;
    }

    Node * res = createTernaryOpNode(qmarkToken, expr, ifTrue, ifFalse);
    return res;
  }